

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O3

size_t __thiscall
tchecker::pool_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>::collect
          (pool_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_> *this)

{
  size_t sVar1;
  long *plVar2;
  size_t sVar3;
  void *pend;
  long *plVar4;
  long *plVar5;
  void *pbegin;
  long *plVar6;
  
  plVar2 = (long *)this->_block_head;
  if (plVar2 != (long *)0x0) {
    sVar3 = 0;
    plVar6 = (long *)0x0;
    plVar4 = (long *)0x0;
    do {
      sVar1 = this->_block_size;
      if (sVar1 != 8) {
        plVar5 = plVar2 + 1;
        do {
          if ((this->_raw_head <= plVar5) && (plVar5 < this->_raw_end)) break;
          if (*plVar5 == 0) {
            *plVar5 = -1;
            zg::zone_t::~zone_t((zone_t *)(plVar5 + 1));
            plVar5[1] = (long)plVar6;
            if (plVar4 == (long *)0x0) {
              plVar4 = plVar5;
            }
            sVar3 = sVar3 + 1;
            plVar6 = plVar5;
          }
          plVar5 = (long *)((long)plVar5 + this->_alloc_size);
        } while (plVar5 != (long *)(sVar1 + (long)plVar2));
      }
      plVar2 = (long *)*plVar2;
    } while (plVar2 != (long *)0x0);
    if (sVar3 != 0) {
      plVar4[1] = (long)this->_free_head;
      this->_free_head = (char *)plVar6;
      return sVar3;
    }
  }
  return 0;
}

Assistant:

std::size_t collect()
  {
    std::size_t collected = 0;
    void *collected_begin = nullptr, *collected_end = nullptr;

    // Move to the free list all chunks in blocks list that are not in the
    // free list and that are unused
    for (void * block = _block_head; block != nullptr; block = nextblock(block)) {
      void * block_end = static_cast<char *>(block) + _block_size;

      for (char * chunk = first_chunk_ptr(block); chunk != block_end; chunk += _alloc_size) {
        // Ignore chunks inside unused raw block (refcount not set yet)
        if ((_raw_head <= chunk) && (chunk < _raw_end))
          break; // ignore the entire raw block

        // Collect all unused chunks in the free list
        typename T::refcount_t * refcount = reinterpret_cast<typename T::refcount_t *>(chunk);
        if (*refcount == COLLECTABLE_CHUNK) {
          // make the chunk free using its refcount
          *refcount = FREE_CHUNK;
          // destruct the object in the chunk
          T * t = reinterpret_cast<T *>(refcount + 1);
          T::destruct(t); // t->~T()
          // add the chunk to the list of collected chunks
          this->nextchunk(chunk) = collected_begin;
          if (collected_end == nullptr)
            collected_end = chunk;
          collected_begin = chunk;
          ++collected;
        }
      }
    }

    // release the collected chunks
    if (collected > 0)
      this->release(collected_begin, collected_end);

    return collected;
  }